

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O0

void writeTxa<TxaHeaderPS3>(ostream *stream,TxaHeader *header,istream *reference)

{
  bool bVar1;
  long lVar2;
  long in_RDX;
  long in_RSI;
  string *in_RDI;
  string s;
  Chunk c;
  TxaChunk *chunk;
  const_iterator __end1;
  const_iterator __begin1;
  vector<TxaChunk,_std::allocator<TxaChunk>_> *__range1;
  TxaHeaderPS3 h;
  undefined4 in_stack_ffffffffffffff38;
  undefined2 in_stack_ffffffffffffff3c;
  unsigned_short in_stack_ffffffffffffff3e;
  ostream *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  ostream local_88 [32];
  TxaChunkPS3 local_68;
  reference local_58;
  TxaChunk *local_50;
  __normal_iterator<const_TxaChunk_*,_std::vector<TxaChunk,_std::allocator<TxaChunk>_>_> local_48;
  long local_40;
  TxaHeaderPS3 local_38;
  long local_10;
  string *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::istream::seekg(in_RDX,_S_beg);
  readRaw<TxaHeaderPS3>((istream *)in_stack_ffffffffffffff40);
  boost::endian::endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
  ::operator=((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0> *
              )in_stack_ffffffffffffff40,
              CONCAT22(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff3c));
  TxaHeaderPS3::setIndexSize(&local_38,*(uint32_t *)(local_10 + 0x10));
  boost::endian::endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
  ::operator=((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0> *
              )in_stack_ffffffffffffff40,
              CONCAT22(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff3c));
  boost::endian::endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
  ::operator=((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0> *
              )in_stack_ffffffffffffff40,
              CONCAT22(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff3c));
  writeRaw<TxaHeaderPS3>
            (in_stack_ffffffffffffff40,
             (TxaHeaderPS3 *)
             CONCAT26(in_stack_ffffffffffffff3e,
                      CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)));
  local_40 = local_10 + 0x18;
  local_48._M_current =
       (TxaChunk *)
       std::vector<TxaChunk,_std::allocator<TxaChunk>_>::begin
                 ((vector<TxaChunk,_std::allocator<TxaChunk>_> *)
                  CONCAT26(in_stack_ffffffffffffff3e,
                           CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)));
  local_50 = (TxaChunk *)
             std::vector<TxaChunk,_std::allocator<TxaChunk>_>::end
                       ((vector<TxaChunk,_std::allocator<TxaChunk>_> *)
                        CONCAT26(in_stack_ffffffffffffff3e,
                                 CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_TxaChunk_*,_std::vector<TxaChunk,_std::allocator<TxaChunk>_>_>
                        *)in_stack_ffffffffffffff40,
                       (__normal_iterator<const_TxaChunk_*,_std::vector<TxaChunk,_std::allocator<TxaChunk>_>_>
                        *)CONCAT26(in_stack_ffffffffffffff3e,
                                   CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)));
    if (!bVar1) break;
    local_58 = __gnu_cxx::
               __normal_iterator<const_TxaChunk_*,_std::vector<TxaChunk,_std::allocator<TxaChunk>_>_>
               ::operator*(&local_48);
    boost::endian::
    endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::operator=
              ((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3e);
    boost::endian::
    endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::operator=
              ((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3e);
    boost::endian::
    endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::operator=
              ((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3e);
    boost::endian::
    endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>::operator=
              ((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
                *)in_stack_ffffffffffffff40,
               CONCAT22(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff3c));
    boost::endian::
    endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>::operator=
              ((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
                *)in_stack_ffffffffffffff40,
               CONCAT22(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff3c));
    TxaChunkPS3::setDecLength(&local_68,local_58->decodedLength);
    fromUTF8(in_stack_ffffffffffffff48);
    lVar2 = std::__cxx11::string::size();
    align(lVar2 + 1,4);
    std::__cxx11::string::resize((ulong)local_88);
    std::__cxx11::string::size();
    boost::endian::
    endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::operator=
              ((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3e);
    writeRaw<TxaChunkPS3>
              (in_stack_ffffffffffffff40,
               (TxaChunkPS3 *)
               CONCAT26(in_stack_ffffffffffffff3e,
                        CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)));
    in_stack_ffffffffffffff40 = local_88;
    in_stack_ffffffffffffff48 = local_8;
    lVar2 = std::__cxx11::string::data();
    std::__cxx11::string::size();
    std::ostream::write((char *)in_stack_ffffffffffffff48,lVar2);
    std::__cxx11::string::~string((string *)local_88);
    __gnu_cxx::
    __normal_iterator<const_TxaChunk_*,_std::vector<TxaChunk,_std::allocator<TxaChunk>_>_>::
    operator++(&local_48);
  }
  return;
}

Assistant:

void writeTxa(std::ostream& stream, const TxaHeader& header, std::istream& reference) {
	reference.seekg(0, reference.beg);
	Header h = readRaw<Header>(reference);
	h.size = header.filesize;
	h.setIndexSize(header.indexSize);
	h.indexed = header.indexed;
	h.largestDecodedChunk = header.largestDecodedChunk;

	writeRaw(stream, h);
	for (const auto& chunk : header.chunks) {
		typename Header::Chunk c;
		c.index = chunk.index;
		c.width = chunk.width;
		c.height = chunk.height;
		c.entryOffset = chunk.offset;
		c.entryLength = chunk.length;
		c.setDecLength(chunk.decodedLength);
		std::string s = fromUTF8(chunk.name);
		s.resize(align(s.size() + 1, 4));
		c.headerLength = sizeof(c) + s.size();
		writeRaw(stream, c);
		stream.write(s.data(), s.size());
	}
}